

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

void * utf8chr(void *src,long chr)

{
  char *pcVar1;
  ulong uVar2;
  ulong in_RAX;
  void *pvVar3;
  undefined1 uVar4;
  void *pvVar5;
  char c [5];
  undefined8 local_8;
  
  local_8 = in_RAX & 0xffffff0000000000;
  if (chr == 0) {
    pvVar5 = (void *)((long)src + -1);
    do {
      pvVar3 = (void *)((long)pvVar5 + 1);
      pcVar1 = (char *)((long)pvVar5 + 1);
      pvVar5 = pvVar3;
    } while (*pcVar1 != '\0');
  }
  else {
    uVar4 = (undefined1)chr;
    if ((chr & 0xffffff80U) == 0) {
      local_8 = CONCAT71(local_8._1_7_,uVar4);
    }
    else if ((chr & 0xfffff800U) == 0) {
      local_8 = CONCAT62(local_8._2_6_,CONCAT11(uVar4,(char)((ulong)chr >> 6))) & 0xffffffffffff3fff
                | 0x80c0;
    }
    else if ((short)((ulong)chr >> 0x10) == 0) {
      uVar2 = CONCAT62(local_8._2_6_,
                       CONCAT11((char)((ulong)chr >> 6),(char)((chr & 0xffffU) >> 0xc))) &
              0xffffffffffff3fff;
      local_8._3_5_ = (undefined5)(uVar2 >> 0x18);
      local_8 = CONCAT53(local_8._3_5_,CONCAT12(uVar4,(short)uVar2)) & 0xffffffffff3fffff | 0x8080e0
      ;
    }
    else {
      uVar2 = CONCAT62(local_8._2_6_,CONCAT11((char)((ulong)chr >> 0xc),(char)((ulong)chr >> 0x12)))
              & 0xffffffffffff3fff;
      local_8._3_5_ = (undefined5)(uVar2 >> 0x18);
      uVar2 = CONCAT53(local_8._3_5_,CONCAT12((char)((ulong)chr >> 6),(short)uVar2)) &
              0xffffffffff3fffff;
      local_8._4_4_ = (undefined4)(uVar2 >> 0x20);
      local_8 = CONCAT44(local_8._4_4_,CONCAT13(uVar4,(int3)uVar2)) & 0xffffffff3fffffff |
                0x808080f0;
    }
    pvVar3 = utf8str(src,&local_8);
  }
  return pvVar3;
}

Assistant:

void *utf8chr(const void *src, long chr) {
  char c[5] = {'\0', '\0', '\0', '\0', '\0'};

  if (0 == chr) {
    // being asked to return position of null terminating byte, so
    // just run s to the end, and return!
    const char *s = (const char *)src;
    while ('\0' != *s) {
      s++;
    }
    return (void *)s;
  } else if (0 == ((long)0xffffff80 & chr)) {
    // 1-byte/7-bit ascii
    // (0b0xxxxxxx)
    c[0] = (char)chr;
  } else if (0 == ((long)0xfffff800 & chr)) {
    // 2-byte/11-bit utf8 code point
    // (0b110xxxxx 0b10xxxxxx)
    c[0] = 0xc0 | (char)(chr >> 6);
    c[1] = 0x80 | (char)(chr & 0x3f);
  } else if (0 == ((long)0xffff0000 & chr)) {
    // 3-byte/16-bit utf8 code point
    // (0b1110xxxx 0b10xxxxxx 0b10xxxxxx)
    c[0] = 0xe0 | (char)(chr >> 12);
    c[1] = 0x80 | (char)((chr >> 6) & 0x3f);
    c[2] = 0x80 | (char)(chr & 0x3f);
  } else { // if (0 == ((int)0xffe00000 & chr)) {
    // 4-byte/21-bit utf8 code point
    // (0b11110xxx 0b10xxxxxx 0b10xxxxxx 0b10xxxxxx)
    c[0] = 0xf0 | (char)(chr >> 18);
    c[1] = 0x80 | (char)((chr >> 12) & 0x3f);
    c[2] = 0x80 | (char)((chr >> 6) & 0x3f);
    c[3] = 0x80 | (char)(chr & 0x3f);
  }

  // we've made c into a 2 utf8 codepoint string, one for the chr we are
  // seeking, another for the null terminating byte. Now use utf8str to
  // search
  return utf8str(src, c);
}